

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeIsAlnum(Unicode61Tokenizer *p,int iCode)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iCode_local;
  Unicode61Tokenizer *p_local;
  
  iVar2 = sqlite3Fts5UnicodeCategory(iCode);
  bVar1 = p->aCategory[iVar2];
  uVar3 = fts5UnicodeIsException(p,iCode);
  return bVar1 ^ uVar3;
}

Assistant:

static int fts5UnicodeIsAlnum(Unicode61Tokenizer *p, int iCode){
  return (
    p->aCategory[sqlite3Fts5UnicodeCategory((u32)iCode)]
    ^ fts5UnicodeIsException(p, iCode)
  );
}